

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Own<kj::_::FiberStack,_std::nullptr_t> __thiscall kj::FiberPool::Impl::takeStack(Impl *this)

{
  size_t *psVar1;
  _func_int *p_Var2;
  _func_int *p_Var3;
  bool bVar4;
  _func_int *p_Var5;
  FiberStack *pFVar6;
  FiberStack *extraout_RDX;
  FiberStack *extraout_RDX_00;
  _func_int **in_RSI;
  size_t sVar7;
  long lVar8;
  bool bVar9;
  Own<kj::_::FiberStack,_std::nullptr_t> OVar10;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  lookupCoreLocalFreelist((Impl *)&stack0xffffffffffffffc0);
  pFVar6 = (FiberStack *)CONCAT71(uStack_3f,local_40);
  if (pFVar6 != (FiberStack *)0x0) {
    bVar9 = false;
    LOCK();
    sVar7 = pFVar6->stackSize;
    pFVar6->stackSize = 0;
    UNLOCK();
    if (sVar7 == 0) {
      bVar4 = false;
      lVar8 = 0;
      do {
        bVar9 = lVar8 == 8;
        if (bVar9) goto LAB_002718c0;
        LOCK();
        psVar1 = (size_t *)((long)&(pFVar6->main).tag + lVar8);
        sVar7 = *psVar1;
        *psVar1 = 0;
        UNLOCK();
        lVar8 = lVar8 + 8;
      } while (sVar7 == 0);
    }
    (this->super_Disposer)._vptr_Disposer = in_RSI;
    this->stackSize = sVar7;
    bVar4 = true;
LAB_002718c0:
    if (!bVar9) goto LAB_002718c6;
  }
  bVar4 = false;
LAB_002718c6:
  if (!bVar4) {
    local_40 = 0;
    kj::_::Mutex::lock((Mutex *)(in_RSI + 3));
    p_Var2 = in_RSI[8];
    p_Var3 = in_RSI[0xc];
    if (p_Var3 != p_Var2) {
      p_Var5 = p_Var3;
      if (p_Var3 == in_RSI[0xd]) {
        p_Var5 = (_func_int *)(*(long *)(in_RSI[0xf] + -8) + 0x200);
      }
      sVar7 = *(size_t *)(p_Var5 + -8);
      std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::pop_back
                ((deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)(in_RSI + 6));
      (this->super_Disposer)._vptr_Disposer = in_RSI;
      this->stackSize = sVar7;
    }
    kj::_::Mutex::unlock((Mutex *)(in_RSI + 3),EXCLUSIVE,(Waiter *)0x0);
    pFVar6 = extraout_RDX;
    if (p_Var3 == p_Var2) {
      pFVar6 = (FiberStack *)operator_new(0x20);
      kj::_::FiberStack::FiberStack(pFVar6,(size_t)in_RSI[1]);
      (this->super_Disposer)._vptr_Disposer = in_RSI;
      this->stackSize = (size_t)pFVar6;
      pFVar6 = extraout_RDX_00;
    }
  }
  OVar10.ptr = pFVar6;
  OVar10.disposer = &this->super_Disposer;
  return OVar10;
}

Assistant:

Own<_::FiberStack> takeStack() const {
    // Get a stack from the pool. The disposer on the returned Own pointer will return the stack
    // to the pool, provided that reset() has been called to indicate that the stack is not in
    // a weird state.

#if USE_CORE_LOCAL_FREELISTS
    KJ_IF_SOME(core, lookupCoreLocalFreelist()) {
      for (auto& stackPtr: core.stacks) {
        _::FiberStack* result = __atomic_exchange_n(&stackPtr, nullptr, __ATOMIC_ACQUIRE);
        if (result != nullptr) {
          // Found a stack in this slot!
          return { result, *this };
        }
      }
      // No stacks found, fall back to global freelist.
    }
#endif

    {
      auto lock = freelist.lockExclusive();
      if (!lock->empty()) {
        _::FiberStack* result = lock->back();
        lock->pop_back();
        return { result, *this };
      }
    }

    _::FiberStack* result = new _::FiberStack(stackSize);
    return { result, *this };
  }